

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

void __thiscall
cmCTestCoverageHandler::CleanCoverageLogFiles(cmCTestCoverageHandler *this,ostream *log)

{
  cmCTest *this_00;
  string *psVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  ostream *poVar3;
  string *f;
  string *source;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string logGlob;
  Glob gl;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  undefined1 local_88 [16];
  _Alloc_hider local_78;
  size_type local_70;
  char *local_68 [2];
  size_type local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  char *local_38;
  undefined8 local_30;
  
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"BuildDirectory","");
  cmCTest::GetCTestConfiguration(&local_c8,this_00,&local_e8);
  cmCTest::GetCurrentTag_abi_cxx11_(&local_108,(this->super_cmCTestGenericHandler).CTest);
  local_88._0_8_ = local_c8._M_string_length;
  local_88._8_8_ = local_c8._M_dataplus._M_p;
  local_70 = 9;
  local_68[0] = "/Testing/";
  local_68[1] = (char *)0x0;
  local_58 = local_108._M_string_length;
  local_50 = (pointer)local_108._M_dataplus._M_p;
  local_40 = (pointer)0xd;
  local_38 = "/CoverageLog*";
  local_30 = 0;
  views._M_len = 4;
  views._M_array = (iterator)local_88;
  local_78._M_p = (pointer)&local_c8;
  local_48 = &local_108;
  cmCatViews(&local_a8,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  cmsys::Glob::Glob((Glob *)local_88);
  cmsys::Glob::FindFiles((Glob *)local_88,&local_a8,(GlobMessages *)0x0);
  pvVar2 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_88);
  psVar1 = (pvVar2->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (source = (pvVar2->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; source != psVar1; source = source + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(log,"Removing old coverage log: ",0x1b);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (log,(source->_M_dataplus)._M_p,source->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    cmsys::SystemTools::RemoveFile(source);
  }
  cmsys::Glob::~Glob((Glob *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestCoverageHandler::CleanCoverageLogFiles(std::ostream& log)
{
  std::string logGlob =
    cmStrCat(this->CTest->GetCTestConfiguration("BuildDirectory"), "/Testing/",
             this->CTest->GetCurrentTag(), "/CoverageLog*");
  cmsys::Glob gl;
  gl.FindFiles(logGlob);
  std::vector<std::string> const& files = gl.GetFiles();
  for (std::string const& f : files) {
    log << "Removing old coverage log: " << f << "\n";
    cmSystemTools::RemoveFile(f);
  }
}